

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void kj::anon_unknown_70::terminateHandler(void)

{
  void **ppvVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *in_RCX;
  ArrayPtr<void_*const> *params_1;
  ArrayPtr<void_*const> *pAVar5;
  void *__buf;
  int __fd;
  char *in_R9;
  char *ptrCopy;
  ArrayPtr<void_*const> AVar6;
  ArrayPtr<void_*> space;
  exception_ptr eptr;
  void *traceSpace [32];
  ArrayPtr<void_*const> local_1a8;
  undefined8 *local_198;
  String local_188;
  String local_168;
  long local_150;
  long local_148;
  undefined1 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec1 [15];
  kj local_128 [264];
  
  memset(local_128,0,0x100);
  space.size_ = 3;
  space.ptr = (void **)&DAT_00000020;
  AVar6 = getStackTrace(local_128,space,(uint)in_RCX);
  std::current_exception();
  if (local_148 == 0) {
    local_1a8 = AVar6;
    strArray<kj::ArrayPtr<void*const>&>
              (&local_188,(kj *)&local_1a8,(ArrayPtr<void_*const> *)0x521b7c,in_RCX);
    AVar6._1_15_ = in_stack_fffffffffffffec1;
    AVar6.ptr._0_1_ = in_stack_fffffffffffffec0;
    stringifyStackTrace(AVar6);
    params_1 = &local_1a8;
    str<char_const(&)[54],kj::String,kj::String,char>
              (&local_168,(kj *)"*** std::terminate() called with no exception\nstack: ",
               (char (*) [54])&local_188,(String *)params_1,(String *)&stack0xfffffffffffffec0,in_R9
              );
    sVar3 = local_168.content.size_;
    __fd = (int)local_168.content.ptr;
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    ppvVar1 = local_1a8.ptr;
    if (local_1a8.ptr != (void **)0x0) {
      params_1 = (ArrayPtr<void_*const> *)local_1a8.size_;
      local_1a8 = (ArrayPtr<void_*const>)ZEXT816(0);
      (**(code **)*local_198)(local_198,ppvVar1,1,params_1,params_1,0);
    }
    pAVar5 = (ArrayPtr<void_*const> *)local_188.content.size_;
    pcVar2 = local_188.content.ptr;
    if (local_188.content.ptr != (char *)0x0) {
      local_188.content.ptr = (char *)0x0;
      local_188.content.size_ = 0;
      (**(local_188.content.disposer)->_vptr_ArrayDisposer)
                (local_188.content.disposer,pcVar2,1,pAVar5,pAVar5,0);
      params_1 = pAVar5;
    }
    local_168.content.ptr = (char *)&PTR__FdOutputStream_0064b0e0;
    local_168.content.size_ = 0xffffffff00000002;
    if (sVar3 == 0) {
      __fd = 0;
    }
    __buf = (void *)0x0;
    if (sVar3 != 0) {
      __buf = (void *)(sVar3 - 1);
    }
    FdOutputStream::write((FdOutputStream *)&local_168,__fd,__buf,(size_t)params_1);
    FdOutputStream::~FdOutputStream((FdOutputStream *)&local_168);
    _exit(1);
  }
  local_150 = local_148;
  if (local_148 != 0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar4 = std::rethrow_exception((exception_ptr)&local_150);
  __clang_call_terminate(uVar4);
}

Assistant:

[[noreturn]] void terminateHandler() {
  void* traceSpace[32]{};

  // ignoreCount = 3 to ignore std::terminate entry.
  auto trace = kj::getStackTrace(traceSpace, 3);

  kj::String message;

  auto eptr = std::current_exception();
  if (eptr != nullptr) {
    try {
      std::rethrow_exception(eptr);
    } catch (const kj::Exception& exception) {
      message = kj::str("*** Fatal uncaught kj::Exception: ", exception, '\n');
    } catch (const std::exception& exception) {
      message = kj::str("*** Fatal uncaught std::exception: ", exception.what(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    } catch (...) {
      message = kj::str("*** Fatal uncaught exception of type: ", kj::getCaughtExceptionType(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    }
  } else {
    message = kj::str("*** std::terminate() called with no exception"
                      "\nstack: ", stringifyStackTraceAddresses(trace),
                                   stringifyStackTrace(trace), '\n');
  }

  kj::FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}